

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

AtomSpan __thiscall Potassco::SmodelsConvert::SmData::mapHead(SmData *this,AtomSpan *h)

{
  bool bVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  Span<unsigned_int> *in_RSI;
  SmData *in_RDI;
  Span<unsigned_int> SVar3;
  AtomSpan AVar4;
  Atom_t *x;
  undefined4 in_stack_ffffffffffffffa8;
  Atom_t in_stack_ffffffffffffffac;
  SmData *in_stack_ffffffffffffffb0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_28;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x11c6a1);
  local_28 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)begin<unsigned_int>(in_RSI);
  while (this_00 = local_28,
        pvVar2 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 end<unsigned_int>((Span<unsigned_int> *)0x11c6c4), this_00 != pvVar2) {
    mapHeadAtom(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffb0,
               (value_type_conflict1 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
              );
    local_28 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(local_28->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + 4);
  }
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(this_00);
  if (bVar1) {
    in_stack_ffffffffffffffb0 = (SmData *)&in_RDI->head_;
    falseAtom(in_RDI);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffb0,
               (value_type_conflict1 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
              );
  }
  SVar3 = toSpan<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffffb0);
  AVar4.first = SVar3.first;
  AVar4.size = SVar3.size;
  return AVar4;
}

Assistant:

AtomSpan SmodelsConvert::SmData::mapHead(const AtomSpan& h) {
	head_.clear();
	for (const Atom_t* x = begin(h); x != end(h); ++x) {
		head_.push_back(mapHeadAtom(*x));
	}
	if (head_.empty()) { head_.push_back(falseAtom()); }
	return toSpan(head_);
}